

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

TValue * luaT_gettm(Table *events,TMS event,TString *ename)

{
  TKey *pTVar1;
  TValue *tm;
  TString *ename_local;
  TMS event_local;
  Table *events_local;
  int nx;
  TValue *k;
  Node *n;
  Table *local_10;
  
  local_10 = (Table *)(events->node + (ename->hash & events->hmask));
  if (ename->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  pTVar1 = (TKey *)&local_10->array;
  if (*(short *)&local_10->node == -0x7ffc) {
    if (((ulong)local_10->node & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((pTVar1->nk).value_.gc)->tt != '\x04') {
      __assert_fail("((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((ulong)local_10->node & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((TString *)(pTVar1->nk).value_.gc == ename) goto LAB_0013a4d2;
  }
  if (*(int *)((long)&local_10->node + 4) == 0) {
    local_10 = (Table *)&luaO_nilobject_;
  }
  else {
    local_10 = (Table *)luaH_getshortstr_continue(ename,(Node *)local_10);
  }
LAB_0013a4d2:
  if (TM_EQ < event) {
    __assert_fail("event <= TM_EQ",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                  ,0x3d,"const TValue *luaT_gettm(Table *, TMS, TString *)");
  }
  if (*(LuaType *)&local_10->tt == 0) {
    events->flags = events->flags | (byte)(1 << ((byte)event & 0x1f));
    events_local = (Table *)0x0;
  }
  else {
    events_local = local_10;
  }
  return (TValue *)events_local;
}

Assistant:

const TValue *luaT_gettm (Table *events, TMS event, TString *ename) {
  const TValue *tm = luaH_getshortstr(events, ename);
  lua_assert(event <= TM_EQ);
  if (ttisnil(tm)) {  /* no tag method? */
    events->flags |= cast_byte(1u<<event);  /* cache this fact */
    return NULL;
  }
  else return tm;
}